

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall
Parser_componentAttributeIssues_Test::~Parser_componentAttributeIssues_Test
          (Parser_componentAttributeIssues_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, componentAttributeIssues)
{
    const std::string in1 =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"model_name\">\n"
        "  <component lame=\"randy\"/>\n"
        "</model>\n";
    const std::vector<std::string> expectedIssues1 = {
        "Component '' has an invalid attribute 'lame'.",
        "Component does not specify a name attribute.",
    };
    const std::string in2 =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"model_name\">\n"
        "  <component name=\"randy\" son=\"stan\"/>\n"
        "</model>\n";
    const std::vector<std::string> expectedIssues2 = {
        "Component 'randy' has an invalid attribute 'son'.",
    };
    const std::string in3 =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"model_name\">\n"
        "  <component son=\"stan\" name=\"randy\"/>\n"
        "</model>\n";
    const std::vector<std::string> expectedIssues3 = {
        "Component 'randy' has an invalid attribute 'son'.",
    };

    libcellml::ParserPtr p = libcellml::Parser::create();
    p->parseModel(in1);
    EXPECT_EQ_ISSUES(expectedIssues1, p);

    p->parseModel(in2);
    EXPECT_EQ_ISSUES(expectedIssues2, p);

    p->parseModel(in3);
    EXPECT_EQ_ISSUES(expectedIssues3, p);
}